

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipointcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_MinipointCounterTest_ChooseHighestPointsWait_Test::testBody
          (TEST_MinipointCounterTest_ChooseHighestPointsWait_Test *this)

{
  int iVar1;
  int iVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 in_stack_ffffffffffffff48;
  int value;
  NormalTestTerminator local_48;
  NormalTestTerminator local_40;
  SimpleString local_38 [3];
  SimpleString local_20;
  undefined3 local_18;
  undefined2 local_13;
  undefined1 local_11;
  TEST_MinipointCounterTest_ChooseHighestPointsWait_Test *local_10;
  TEST_MinipointCounterTest_ChooseHighestPointsWait_Test *this_local;
  
  value = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_10 = this;
  TEST_GROUP_CppUTestGroupMinipointCounterTest::addPair
            (&this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest,SouthWind);
  TEST_GROUP_CppUTestGroupMinipointCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest,OneOfCharacters,false);
  TEST_GROUP_CppUTestGroupMinipointCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest,OneOfCircles,true);
  TEST_GROUP_CppUTestGroupMinipointCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest,OneOfBamboos,true);
  TEST_GROUP_CppUTestGroupMinipointCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest,ThreeOfCharacters,false);
  (this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).h.last_tile = ThreeOfCharacters;
  local_13 = 0;
  local_11 = 0;
  local_18 = 0;
  mahjong::WiningState::winByDiscard
            (&(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).s,
             (WinByDiscardSituation)0x0);
  iVar1 = mahjong::MinipointCounter::total
                    (&(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).m,false);
  if (iVar1 == 0x16) {
    pUVar3 = UtestShell::getCurrent();
    local_48.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_48);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/minipointcounter_test.cpp"
               ,0xb3,&local_48);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1bd79d);
  }
  else {
    iVar1 = mahjong::MinipointCounter::total
                      (&(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).m,false);
    iVar2 = mahjong::MinipointCounter::total
                      (&(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).m,false);
    if (iVar1 != iVar2) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/minipointcounter_test.cpp"
                 ,0xb3);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_20);
    mahjong::MinipointCounter::total
              (&(this->super_TEST_GROUP_CppUTestGroupMinipointCounterTest).m,false);
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(local_38);
    local_40.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_40);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/minipointcounter_test.cpp"
               ,CONCAT44(value,0xb3),&local_40);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1bd6dd);
    SimpleString::~SimpleString((SimpleString *)0x1bd6e6);
    SimpleString::~SimpleString((SimpleString *)0x1bd6ef);
  }
  return;
}

Assistant:

TEST(MinipointCounterTest, ChooseHighestPointsWait)
{
	addPair(Tile::SouthWind);
	addSequence(Tile::OneOfCharacters, false);
	addSequence(Tile::OneOfCircles, true);
	addSequence(Tile::OneOfBamboos, true);
	addSequence(Tile::ThreeOfCharacters, false);

	h.last_tile = Tile::ThreeOfCharacters;
	s.winByDiscard();
	CHECK_EQUAL(22, m.total(false));
}